

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O1

Stream * rw::writeHAnim(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int32 *piVar1;
  long lVar2;
  long lVar3;
  
  Stream::writeI32(stream,0x100);
  Stream::writeI32(stream,*(int32 *)((long)object + (long)offset));
  piVar1 = *(int32 **)((long)object + (long)offset + 8);
  if (piVar1 == (int32 *)0x0) {
    Stream::writeI32(stream,0);
  }
  else {
    Stream::writeI32(stream,piVar1[1]);
    Stream::writeI32(stream,*piVar1);
    Stream::writeI32(stream,*(int32 *)(*(long *)(piVar1 + 0xc) + 0x18));
    if (0 < piVar1[1]) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        Stream::writeI32(stream,*(int32 *)(*(long *)(piVar1 + 6) + lVar3));
        Stream::writeI32(stream,*(int32 *)(*(long *)(piVar1 + 6) + 4 + lVar3));
        Stream::writeI32(stream,*(int32 *)(*(long *)(piVar1 + 6) + 8 + lVar3));
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x18;
      } while (lVar2 < piVar1[1]);
    }
  }
  return stream;
}

Assistant:

static Stream*
writeHAnim(Stream *stream, int32, void *object, int32 offset, int32)
{
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	stream->writeI32(256);
	stream->writeI32(hanim->id);
	if(hanim->hierarchy == nil){
		stream->writeI32(0);
		return stream;
	}
	HAnimHierarchy *hier = hanim->hierarchy;
	stream->writeI32(hier->numNodes);
	stream->writeI32(hier->flags);
	stream->writeI32(hier->interpolator->maxInterpKeyFrameSize);
	for(int32 i = 0; i < hier->numNodes; i++){
		stream->writeI32(hier->nodeInfo[i].id);
		stream->writeI32(hier->nodeInfo[i].index);
		stream->writeI32(hier->nodeInfo[i].flags);
	}
	return stream;
}